

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TripWireTests.cpp
# Opt level: O0

TriplineType __thiscall gmlc::concurrency::TripWire::getIndexedLine(TripWire *this,uint index)

{
  int iVar1;
  const_reference pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TriplineType TVar3;
  uint index_local;
  
  if (getIndexedLine(unsigned_int)::triplines == '\0') {
    iVar1 = __cxa_guard_acquire(&getIndexedLine(unsigned_int)::triplines);
    if (iVar1 != 0) {
      make_triplines(&getIndexedLine::triplines,10);
      __cxa_atexit(std::
                   vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
                   ::~vector,&getIndexedLine::triplines,&__dso_handle);
      __cxa_guard_release(&getIndexedLine(unsigned_int)::triplines);
    }
  }
  pvVar2 = std::
           vector<std::shared_ptr<std::atomic<bool>_>,_std::allocator<std::shared_ptr<std::atomic<bool>_>_>_>
           ::at(&getIndexedLine::triplines,(ulong)index);
  std::shared_ptr<std::atomic<bool>_>::shared_ptr((shared_ptr<std::atomic<bool>_> *)this,pvVar2);
  TVar3.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  TVar3.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TriplineType)TVar3.super___shared_ptr<std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TEST(tripwire, indexed)
{
    TripWireDetector detect(5);

    EXPECT_FALSE(detect.isTripped());

    EXPECT_THROW(TripWireDetector(12), std::out_of_range);
    // smaller scope for trigger
    {
        TripWireTrigger trig(5);
        EXPECT_FALSE(detect.isTripped());
    }
    EXPECT_TRUE(detect.isTripped());
}